

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O0

size_t __thiscall
binlog::Session::consumeSpecialEntry<binlog::WriterProp,std::ofstream>
          (Session *this,WriterProp *entry,basic_ofstream<char,_std::char_traits<char>_> *out)

{
  size_t sVar1;
  char *pcVar2;
  char *in_RDX;
  size_t size;
  VectorOutputStream *in_stack_ffffffffffffffd8;
  WriterProp *in_stack_ffffffffffffffe0;
  
  detail::VectorOutputStream::clear((VectorOutputStream *)0x10a668);
  sVar1 = serializeSizePrefixedTagged<binlog::WriterProp,binlog::detail::VectorOutputStream>
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pcVar2 = detail::VectorOutputStream::data((VectorOutputStream *)0x10a69c);
  detail::VectorOutputStream::ssize((VectorOutputStream *)0x10a6b1);
  std::ostream::write(in_RDX,(long)pcVar2);
  return sVar1;
}

Assistant:

std::size_t Session::consumeSpecialEntry(const Entry& entry, OutputStream& out)
{
  // Write entry to `_specialEntryBuffer` first, only then to `out` in one go.
  // This makes OutputStream logic simpler (if it parses the stream),
  // as it does not have to deal with partial entries.
  // (serializeSizePrefixedTagged serializes Entry field by field)
  // This is also more efficient if OutputStream does unbuffered I/O.
  _specialEntryBuffer.clear();
  const std::size_t size = serializeSizePrefixedTagged(entry, _specialEntryBuffer);
  out.write(_specialEntryBuffer.data(), _specialEntryBuffer.ssize());
  return size;
}